

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::operator==
               (KNearestNeighborsClassifier *a,KNearestNeighborsClassifier *b)

{
  code *pcVar1;
  bool bVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  IndexTypeCase IVar7;
  IndexTypeCase IVar8;
  DistanceFunctionCase DVar9;
  DistanceFunctionCase DVar10;
  AllowedValuesCase AVar11;
  AllowedValuesCase AVar12;
  ClassLabelsCase CVar13;
  ClassLabelsCase CVar14;
  WeightingSchemeCase WVar15;
  WeightingSchemeCase WVar16;
  NearestNeighborsIndex *pNVar17;
  FloatVector *pFVar18;
  RepeatedField<float> *a_00;
  RepeatedField<float> *b_00;
  Int64Parameter *pIVar19;
  int64_t iVar20;
  int64_t iVar21;
  Int64Range *pIVar22;
  Int64Set *pIVar23;
  Int64Vector *a_01;
  Int64Vector *b_01;
  StringVector *a_02;
  StringVector *b_02;
  long local_e8;
  int64_t i_1;
  int64_t count;
  int i;
  undefined1 local_c0 [8];
  NearestNeighborsIndex bIndex;
  NearestNeighborsIndex aIndex;
  KNearestNeighborsClassifier *b_local;
  KNearestNeighborsClassifier *a_local;
  
  pNVar17 = KNearestNeighborsClassifier::nearestneighborsindex(a);
  NearestNeighborsIndex::NearestNeighborsIndex
            ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1),pNVar17);
  pNVar17 = KNearestNeighborsClassifier::nearestneighborsindex(b);
  NearestNeighborsIndex::NearestNeighborsIndex((NearestNeighborsIndex *)local_c0,pNVar17);
  iVar3 = NearestNeighborsIndex::numberofdimensions
                    ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1));
  iVar4 = NearestNeighborsIndex::numberofdimensions((NearestNeighborsIndex *)local_c0);
  if (iVar3 != iVar4) {
    a_local._7_1_ = false;
    goto LAB_0049bfcb;
  }
  iVar5 = NearestNeighborsIndex::floatsamples_size
                    ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1));
  iVar6 = NearestNeighborsIndex::floatsamples_size((NearestNeighborsIndex *)local_c0);
  if (iVar5 != iVar6) {
    a_local._7_1_ = false;
    goto LAB_0049bfcb;
  }
  for (count._4_4_ = 0;
      iVar5 = NearestNeighborsIndex::floatsamples_size
                        ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1)), count._4_4_ < iVar5;
      count._4_4_ = count._4_4_ + 1) {
    pFVar18 = NearestNeighborsIndex::floatsamples
                        ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1),count._4_4_);
    iVar5 = FloatVector::vector_size(pFVar18);
    pFVar18 = NearestNeighborsIndex::floatsamples((NearestNeighborsIndex *)local_c0,count._4_4_);
    iVar6 = FloatVector::vector_size(pFVar18);
    if (iVar5 != iVar6) {
      a_local._7_1_ = false;
      goto LAB_0049bfcb;
    }
    pFVar18 = NearestNeighborsIndex::floatsamples
                        ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1),count._4_4_);
    a_00 = FloatVector::vector(pFVar18);
    pFVar18 = NearestNeighborsIndex::floatsamples((NearestNeighborsIndex *)local_c0,count._4_4_);
    b_00 = FloatVector::vector(pFVar18);
    bVar2 = operator!=(a_00,b_00);
    if (bVar2) {
      a_local._7_1_ = false;
      goto LAB_0049bfcb;
    }
  }
  IVar7 = NearestNeighborsIndex::IndexType_case((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1));
  IVar8 = NearestNeighborsIndex::IndexType_case((NearestNeighborsIndex *)local_c0);
  if (IVar7 != IVar8) {
    a_local._7_1_ = false;
    goto LAB_0049bfcb;
  }
  DVar9 = NearestNeighborsIndex::DistanceFunction_case
                    ((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1));
  DVar10 = NearestNeighborsIndex::DistanceFunction_case((NearestNeighborsIndex *)local_c0);
  if (DVar9 != DVar10) {
    a_local._7_1_ = false;
    goto LAB_0049bfcb;
  }
  pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
  iVar20 = Int64Parameter::defaultvalue(pIVar19);
  pIVar19 = KNearestNeighborsClassifier::numberofneighbors(b);
  iVar21 = Int64Parameter::defaultvalue(pIVar19);
  if (iVar20 != iVar21) {
    a_local._7_1_ = false;
    goto LAB_0049bfcb;
  }
  pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
  AVar11 = Int64Parameter::AllowedValues_case(pIVar19);
  pIVar19 = KNearestNeighborsClassifier::numberofneighbors(b);
  AVar12 = Int64Parameter::AllowedValues_case(pIVar19);
  if (AVar11 != AVar12) {
    a_local._7_1_ = false;
    goto LAB_0049bfcb;
  }
  pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
  AVar11 = Int64Parameter::AllowedValues_case(pIVar19);
  if (AVar11 != ALLOWEDVALUES_NOT_SET) {
    if (AVar11 == kRange) {
      pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
      pIVar22 = Int64Parameter::range(pIVar19);
      iVar20 = Int64Range::minvalue(pIVar22);
      pIVar19 = KNearestNeighborsClassifier::numberofneighbors(b);
      pIVar22 = Int64Parameter::range(pIVar19);
      iVar21 = Int64Range::minvalue(pIVar22);
      if (iVar20 == iVar21) {
        pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
        pIVar22 = Int64Parameter::range(pIVar19);
        iVar20 = Int64Range::maxvalue(pIVar22);
        pIVar19 = KNearestNeighborsClassifier::numberofneighbors(b);
        pIVar22 = Int64Parameter::range(pIVar19);
        iVar21 = Int64Range::maxvalue(pIVar22);
        if (iVar20 == iVar21) goto LAB_0049be44;
      }
      a_local._7_1_ = false;
      goto LAB_0049bfcb;
    }
    if (AVar11 == kSet) {
      pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
      pIVar23 = Int64Parameter::set(pIVar19);
      iVar5 = Int64Set::values_size(pIVar23);
      pIVar19 = KNearestNeighborsClassifier::numberofneighbors(b);
      pIVar23 = Int64Parameter::set(pIVar19);
      iVar6 = Int64Set::values_size(pIVar23);
      if (iVar5 != iVar6) {
        a_local._7_1_ = false;
        goto LAB_0049bfcb;
      }
      pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
      pIVar23 = Int64Parameter::set(pIVar19);
      iVar5 = Int64Set::values_size(pIVar23);
      for (local_e8 = 0; local_e8 < iVar5; local_e8 = local_e8 + 1) {
        pIVar19 = KNearestNeighborsClassifier::numberofneighbors(a);
        pIVar23 = Int64Parameter::set(pIVar19);
        iVar20 = Int64Set::values(pIVar23,(int)local_e8);
        pIVar19 = KNearestNeighborsClassifier::numberofneighbors(b);
        pIVar23 = Int64Parameter::set(pIVar19);
        iVar21 = Int64Set::values(pIVar23,(int)local_e8);
        if (iVar20 != iVar21) {
          a_local._7_1_ = false;
          goto LAB_0049bfcb;
        }
      }
    }
  }
LAB_0049be44:
  CVar13 = KNearestNeighborsClassifier::ClassLabels_case(a);
  CVar14 = KNearestNeighborsClassifier::ClassLabels_case(b);
  if (CVar13 == CVar14) {
    CVar13 = KNearestNeighborsClassifier::ClassLabels_case(a);
    if (CVar13 == CLASSLABELS_NOT_SET) {
      a_local._7_1_ = true;
    }
    else if (CVar13 == kStringClassLabels) {
      a_02 = KNearestNeighborsClassifier::stringclasslabels(a);
      b_02 = KNearestNeighborsClassifier::stringclasslabels(b);
      a_local._7_1_ = operator==(a_02,b_02);
    }
    else if (CVar13 == kInt64ClassLabels) {
      a_01 = KNearestNeighborsClassifier::int64classlabels(a);
      b_01 = KNearestNeighborsClassifier::int64classlabels(b);
      a_local._7_1_ = operator==(a_01,b_01);
    }
    else {
      WVar15 = KNearestNeighborsClassifier::WeightingScheme_case(a);
      WVar16 = KNearestNeighborsClassifier::WeightingScheme_case(b);
      if (WVar15 == WVar16) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      a_local._7_1_ = false;
    }
  }
  else {
    a_local._7_1_ = false;
  }
LAB_0049bfcb:
  NearestNeighborsIndex::~NearestNeighborsIndex((NearestNeighborsIndex *)local_c0);
  NearestNeighborsIndex::~NearestNeighborsIndex((NearestNeighborsIndex *)(bIndex._oneof_case_ + 1));
  return a_local._7_1_;
}

Assistant:

bool operator==(const KNearestNeighborsClassifier& a,
                        const KNearestNeighborsClassifier& b) {
            auto aIndex = a.nearestneighborsindex();
            auto bIndex = b.nearestneighborsindex();
            if (aIndex.numberofdimensions() != bIndex.numberofdimensions()) {
                return false;
            }
            if (aIndex.floatsamples_size() != bIndex.floatsamples_size()) {
                return false;
            }
            for (int i = 0; i < aIndex.floatsamples_size(); i++) {
                if (aIndex.floatsamples(i).vector_size() != bIndex.floatsamples(i).vector_size()) {
                    return false;
                }
                if (aIndex.floatsamples(i).vector() != bIndex.floatsamples(i).vector()) {
                    return false;
                }
            }
            if (aIndex.IndexType_case() != bIndex.IndexType_case()) {
                return false;
            }
            if (aIndex.DistanceFunction_case() != bIndex.DistanceFunction_case()) {
                return false;
            }
            if (a.numberofneighbors().defaultvalue() != b.numberofneighbors().defaultvalue()) {
                return false;
            }
            if (a.numberofneighbors().AllowedValues_case() != b.numberofneighbors().AllowedValues_case()) {
                return false;
            }
            switch (a.numberofneighbors().AllowedValues_case()) {
                case Specification::Int64Parameter::AllowedValuesCase::kRange:
                {
                    if (a.numberofneighbors().range().minvalue() != b.numberofneighbors().range().minvalue() || a.numberofneighbors().range().maxvalue() != b.numberofneighbors().range().maxvalue()) {
                        return false;
                    }
                    break;
                }
                case Specification::Int64Parameter::AllowedValuesCase::kSet:
                {
                    if (a.numberofneighbors().set().values_size() != b.numberofneighbors().set().values_size()) {
                        return false;
                    }
                    int64_t count = a.numberofneighbors().set().values_size();
                    for (int64_t i = 0; i < count; i++) {
                        if (a.numberofneighbors().set().values((int)i) != b.numberofneighbors().set().values((int)i)) {
                            return false;
                        }
                    } // for i in set
                    break;
                } // case kSet
                case Specification::Int64Parameter::AllowedValuesCase::ALLOWEDVALUES_NOT_SET:
                    break;
            } // switch AllowedValuesCase
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case KNearestNeighborsClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case KNearestNeighborsClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case KNearestNeighborsClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            if (a.WeightingScheme_case() != b.WeightingScheme_case()) {
                return false;
            }
        }